

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::ConjunctionExpression::ToString<duckdb::BoundConjunctionExpression,duckdb::Expression>
          (string *__return_storage_ptr__,ConjunctionExpression *this,
          BoundConjunctionExpression *entry)

{
  ExpressionType *this_00;
  const_reference pvVar1;
  pointer pEVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this[1].super_ParsedExpression.super_BaseExpression.type;
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)this_00,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_f0,pEVar2);
  ::std::operator+(&result,"(",&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  uVar3 = extraout_RDX;
  for (__n = 1; __n < (ulong)((long)this[1].super_ParsedExpression.super_BaseExpression.alias.
                                    _M_dataplus._M_p -
                              *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type >>
                             3); __n = __n + 1) {
    ExpressionTypeToOperator_abi_cxx11_
              (&local_70,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
               (ExpressionType)uVar3);
    ::std::operator+(&local_50," ",&local_70);
    ::std::operator+(&local_90,&local_50," ");
    pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)this_00,__n);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar1);
    (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_b0,pEVar2);
    ::std::operator+(&local_f0,&local_90,&local_b0);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    uVar3 = extraout_RDX_00;
  }
  ::std::operator+(__return_storage_ptr__,&result,")");
  ::std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		string result = "(" + entry.children[0]->ToString();
		for (idx_t i = 1; i < entry.children.size(); i++) {
			result += " " + ExpressionTypeToOperator(entry.GetExpressionType()) + " " + entry.children[i]->ToString();
		}
		return result + ")";
	}